

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

lostFraction __thiscall
llvm::detail::IEEEFloat::multiplySignificand(IEEEFloat *this,IEEEFloat *rhs,IEEEFloat *addend)

{
  uint uVar1;
  fltSemantics *pfVar2;
  Significand SVar3;
  undefined8 uVar4;
  short sVar5;
  uint uVar6;
  opStatus oVar7;
  lostFraction lVar8;
  lostFraction lVar9;
  Significand dst;
  fltSemantics *pfVar10;
  Significand SVar11;
  Significand *rhs_00;
  uint lhsParts;
  uint uVar12;
  uint Count;
  bool bVar13;
  bool ignored;
  uint local_ac;
  Significand *local_a8;
  IEEEFloat *local_a0;
  fltSemantics extendedSemantics;
  IEEEFloat extendedAddend;
  integerPart scratch [4];
  
  pfVar2 = rhs->semantics;
  if (this->semantics != pfVar2) {
    __assert_fail("semantics == rhs.semantics",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x3b9,
                  "lostFraction llvm::detail::IEEEFloat::multiplySignificand(const IEEEFloat &, const IEEEFloat *)"
                 );
  }
  uVar1 = this->semantics->precision;
  local_ac = uVar1 * 2 + 0x40;
  uVar12 = local_ac >> 6;
  local_a0 = addend;
  if (local_ac < 0x140) {
    dst.parts = scratch;
  }
  else {
    dst.parts = (integerPart *)operator_new__((ulong)(uVar12 * 8));
  }
  local_a8 = &this->significand;
  if (uVar1 - 0x40 < 0xffffff80) {
    local_a8 = (Significand *)(this->significand).parts;
  }
  lhsParts = uVar1 + 0x40 >> 6;
  if (pfVar2->precision - 0x40 < 0xffffff80) {
    rhs_00 = (Significand *)(rhs->significand).parts;
  }
  else {
    rhs_00 = &rhs->significand;
  }
  APInt::tcFullMultiply((WordType *)dst,&local_a8->part,&rhs_00->part,lhsParts,lhsParts);
  uVar6 = APInt::tcMSB((WordType *)dst,uVar12);
  uVar6 = uVar6 + 1;
  sVar5 = rhs->exponent + this->exponent + 2;
  this->exponent = sVar5;
  lVar8 = lfExactlyZero;
  if ((local_a0 != (IEEEFloat *)0x0) && ((local_a0->field_0x12 & 7) != 3)) {
    pfVar2 = this->semantics;
    SVar3 = this->significand;
    Count = uVar1 * 2 - uVar6;
    pfVar10 = pfVar2;
    if (Count != 0) {
      if (uVar1 * 2 < uVar6) {
        __assert_fail("extendedPrecision > omsb",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x3e9,
                      "lostFraction llvm::detail::IEEEFloat::multiplySignificand(const IEEEFloat &, const IEEEFloat *)"
                     );
      }
      APInt::tcShiftLeft((WordType *)dst,uVar12,Count);
      this->exponent = this->exponent - (short)Count;
      pfVar10 = this->semantics;
    }
    uVar4._0_2_ = pfVar10->maxExponent;
    uVar4._2_2_ = pfVar10->minExponent;
    uVar4._4_4_ = pfVar10->precision;
    extendedSemantics.sizeInBits = pfVar10->sizeInBits;
    extendedSemantics._0_4_ = SUB84(uVar4,0);
    extendedSemantics.precision = uVar1 * 2 + 1;
    SVar11 = dst;
    if (uVar12 == 1) {
      SVar11.part = *dst.parts;
    }
    (this->significand).parts = (integerPart *)SVar11;
    this->semantics = &extendedSemantics;
    IEEEFloat(&extendedAddend,local_a0);
    oVar7 = convert(&extendedAddend,&extendedSemantics,rmTowardZero,&ignored);
    if (oVar7 != opOK) {
      __assert_fail("status == opOK",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x3fb,
                    "lostFraction llvm::detail::IEEEFloat::multiplySignificand(const IEEEFloat &, const IEEEFloat *)"
                   );
    }
    lVar8 = shiftSignificandRight(&extendedAddend,1);
    if (lVar8 != lfExactlyZero) {
      __assert_fail("lost_fraction == lfExactlyZero && \"Lost precision while shifting addend for fused-multiply-add.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                    ,0x403,
                    "lostFraction llvm::detail::IEEEFloat::multiplySignificand(const IEEEFloat &, const IEEEFloat *)"
                   );
    }
    lVar8 = addOrSubtractSignificand(this,&extendedAddend,false);
    if (uVar12 == 1) {
      *dst.parts = *(integerPart *)&this->significand;
    }
    this->significand = SVar3;
    this->semantics = pfVar2;
    uVar6 = APInt::tcMSB(dst.parts,uVar12);
    uVar6 = uVar6 + 1;
    ~IEEEFloat(&extendedAddend);
    sVar5 = this->exponent;
  }
  this->exponent = sVar5 + ~(ushort)uVar1;
  uVar12 = uVar6 - uVar1;
  if (uVar1 <= uVar6 && uVar12 != 0) {
    lVar9 = shiftRight(dst.parts,uVar6 + 0x3f >> 6,uVar12);
    bVar13 = lVar8 != lfExactlyZero;
    lVar8 = lVar9;
    if (bVar13) {
      if (lVar9 == lfExactlyZero) {
        lVar8 = lfLessThanHalf;
      }
      else {
        lVar8 = lfMoreThanHalf;
        if (lVar9 != lfExactlyHalf) {
          lVar8 = lVar9;
        }
      }
    }
    this->exponent = this->exponent + (short)uVar12;
  }
  uVar1 = local_ac;
  APInt::tcAssign(&local_a8->part,dst.parts,lhsParts);
  if (0x13f < uVar1) {
    operator_delete__(dst.parts);
  }
  return lVar8;
}

Assistant:

lostFraction IEEEFloat::multiplySignificand(const IEEEFloat &rhs,
                                            const IEEEFloat *addend) {
  unsigned int omsb;        // One, not zero, based MSB.
  unsigned int partsCount, newPartsCount, precision;
  integerPart *lhsSignificand;
  integerPart scratch[4];
  integerPart *fullSignificand;
  lostFraction lost_fraction;
  bool ignored;

  assert(semantics == rhs.semantics);

  precision = semantics->precision;

  // Allocate space for twice as many bits as the original significand, plus one
  // extra bit for the addition to overflow into.
  newPartsCount = partCountForBits(precision * 2 + 1);

  if (newPartsCount > 4)
    fullSignificand = new integerPart[newPartsCount];
  else
    fullSignificand = scratch;

  lhsSignificand = significandParts();
  partsCount = partCount();

  APInt::tcFullMultiply(fullSignificand, lhsSignificand,
                        rhs.significandParts(), partsCount, partsCount);

  lost_fraction = lfExactlyZero;
  omsb = APInt::tcMSB(fullSignificand, newPartsCount) + 1;
  exponent += rhs.exponent;

  // Assume the operands involved in the multiplication are single-precision
  // FP, and the two multiplicants are:
  //   *this = a23 . a22 ... a0 * 2^e1
  //     rhs = b23 . b22 ... b0 * 2^e2
  // the result of multiplication is:
  //   *this = c48 c47 c46 . c45 ... c0 * 2^(e1+e2)
  // Note that there are three significant bits at the left-hand side of the
  // radix point: two for the multiplication, and an overflow bit for the
  // addition (that will always be zero at this point). Move the radix point
  // toward left by two bits, and adjust exponent accordingly.
  exponent += 2;

  if (addend && addend->isNonZero()) {
    // The intermediate result of the multiplication has "2 * precision"
    // signicant bit; adjust the addend to be consistent with mul result.
    //
    Significand savedSignificand = significand;
    const fltSemantics *savedSemantics = semantics;
    fltSemantics extendedSemantics;
    opStatus status;
    unsigned int extendedPrecision;

    // Normalize our MSB to one below the top bit to allow for overflow.
    extendedPrecision = 2 * precision + 1;
    if (omsb != extendedPrecision - 1) {
      assert(extendedPrecision > omsb);
      APInt::tcShiftLeft(fullSignificand, newPartsCount,
                         (extendedPrecision - 1) - omsb);
      exponent -= (extendedPrecision - 1) - omsb;
    }

    /* Create new semantics.  */
    extendedSemantics = *semantics;
    extendedSemantics.precision = extendedPrecision;

    if (newPartsCount == 1)
      significand.part = fullSignificand[0];
    else
      significand.parts = fullSignificand;
    semantics = &extendedSemantics;

    IEEEFloat extendedAddend(*addend);
    status = extendedAddend.convert(extendedSemantics, rmTowardZero, &ignored);
    assert(status == opOK);
    (void)status;

    // Shift the significand of the addend right by one bit. This guarantees
    // that the high bit of the significand is zero (same as fullSignificand),
    // so the addition will overflow (if it does overflow at all) into the top bit.
    lost_fraction = extendedAddend.shiftSignificandRight(1);
    assert(lost_fraction == lfExactlyZero &&
           "Lost precision while shifting addend for fused-multiply-add.");
    (void)lost_fraction;

    lost_fraction = addOrSubtractSignificand(extendedAddend, false);

    /* Restore our state.  */
    if (newPartsCount == 1)
      fullSignificand[0] = significand.part;
    significand = savedSignificand;
    semantics = savedSemantics;

    omsb = APInt::tcMSB(fullSignificand, newPartsCount) + 1;
  }

  // Convert the result having "2 * precision" significant-bits back to the one
  // having "precision" significant-bits. First, move the radix point from
  // poision "2*precision - 1" to "precision - 1". The exponent need to be
  // adjusted by "2*precision - 1" - "precision - 1" = "precision".
  exponent -= precision + 1;

  // In case MSB resides at the left-hand side of radix point, shift the
  // mantissa right by some amount to make sure the MSB reside right before
  // the radix point (i.e. "MSB . rest-significant-bits").
  //
  // Note that the result is not normalized when "omsb < precision". So, the
  // caller needs to call IEEEFloat::normalize() if normalized value is
  // expected.
  if (omsb > precision) {
    unsigned int bits, significantParts;
    lostFraction lf;

    bits = omsb - precision;
    significantParts = partCountForBits(omsb);
    lf = shiftRight(fullSignificand, significantParts, bits);
    lost_fraction = combineLostFractions(lf, lost_fraction);
    exponent += bits;
  }

  APInt::tcAssign(lhsSignificand, fullSignificand, partsCount);

  if (newPartsCount > 4)
    delete [] fullSignificand;

  return lost_fraction;
}